

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_go_generator.cc
# Opt level: O0

void __thiscall
t_go_generator::generate_go_equals_struct
          (t_go_generator *this,ostream *out,t_type *ttype,string *tgt,string *src)

{
  ostream *poVar1;
  string local_50;
  string *local_30;
  string *src_local;
  string *tgt_local;
  t_type *ttype_local;
  ostream *out_local;
  t_go_generator *this_local;
  
  local_30 = src;
  src_local = tgt;
  tgt_local = (string *)ttype;
  ttype_local = (t_type *)out;
  out_local = (ostream *)this;
  t_generator::indent_abi_cxx11_(&local_50,&this->super_t_generator);
  poVar1 = std::operator<<(out,(string *)&local_50);
  poVar1 = std::operator<<(poVar1,"if !");
  poVar1 = std::operator<<(poVar1,(string *)tgt);
  poVar1 = std::operator<<(poVar1,".");
  poVar1 = std::operator<<(poVar1,(string *)&this->equals_method_name_);
  poVar1 = std::operator<<(poVar1,"(");
  poVar1 = std::operator<<(poVar1,(string *)src);
  poVar1 = std::operator<<(poVar1,") { return false }");
  std::operator<<(poVar1,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_50);
  return;
}

Assistant:

void t_go_generator::generate_go_equals_struct(ostream& out,
                                               t_type* ttype,
                                               string tgt,
                                               string src) {
  (void)ttype;
  out << indent() << "if !" << tgt << "." << equals_method_name_ << "(" << src
      << ") { return false }" << endl;
}